

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_readwrite.c
# Opt level: O0

int canvas_readscalar(_glist *x,int natoms,t_atom *vec,int *p_nextmsg,int selectit)

{
  int iVar1;
  int iVar2;
  t_symbol *s;
  t_template *ptVar3;
  t_scalar *y;
  _glist *p_Var4;
  int wasvis;
  int nextmsg;
  t_scalar *sc;
  t_symbol *templatesym;
  t_template *template;
  int local_38;
  int nline;
  int message;
  int selectit_local;
  int *p_nextmsg_local;
  t_atom *vec_local;
  _glist *p_Stack_18;
  int natoms_local;
  _glist *x_local;
  
  iVar2 = *p_nextmsg;
  nline = selectit;
  _message = p_nextmsg;
  p_nextmsg_local = (int *)vec;
  vec_local._4_4_ = natoms;
  p_Stack_18 = x;
  iVar1 = glist_isvisible(x);
  if ((iVar2 < vec_local._4_4_) && (p_nextmsg_local[(long)iVar2 * 4] == 2)) {
    s = canvas_makebindsym(*(t_symbol **)(p_nextmsg_local + (long)iVar2 * 4 + 2));
    *_message = iVar2 + 1;
    ptVar3 = template_findbyname(s);
    if (ptVar3 == (t_template *)0x0) {
      pd_error((void *)0x0,"canvas_read: %s: no such template",s->s_name);
      *_message = vec_local._4_4_;
      x_local._4_4_ = 0;
    }
    else {
      y = scalar_new(p_Stack_18,s);
      if (y == (t_scalar *)0x0) {
        pd_error((void *)0x0,"couldn\'t create scalar \"%s\"",s->s_name);
        *_message = vec_local._4_4_;
        x_local._4_4_ = 0;
      }
      else {
        if (iVar1 != 0) {
          p_Var4 = glist_getcanvas(p_Stack_18);
          *(ushort *)&p_Var4->field_0xe8 = *(ushort *)&p_Var4->field_0xe8 & 0xfffd;
        }
        glist_add(p_Stack_18,&y->sc_gobj);
        iVar2 = canvas_scanbinbuf(vec_local._4_4_,(t_atom *)p_nextmsg_local,&local_38,_message);
        glist_readatoms(p_Stack_18,vec_local._4_4_,(t_atom *)p_nextmsg_local,_message,s,y->sc_vec,
                        iVar2,(t_atom *)(p_nextmsg_local + (long)local_38 * 4));
        if (iVar1 != 0) {
          p_Var4 = glist_getcanvas(p_Stack_18);
          *(ushort *)&p_Var4->field_0xe8 = *(ushort *)&p_Var4->field_0xe8 & 0xfffd | 2;
          gobj_vis(&y->sc_gobj,p_Stack_18,1);
        }
        if (nline != 0) {
          glist_select(p_Stack_18,&y->sc_gobj);
        }
        x_local._4_4_ = 1;
      }
    }
  }
  else {
    if (iVar2 < vec_local._4_4_) {
      post("stopping early: type %d",(ulong)(uint)p_nextmsg_local[(long)iVar2 * 4]);
    }
    *_message = vec_local._4_4_;
    x_local._4_4_ = 0;
  }
  return x_local._4_4_;
}

Assistant:

int canvas_readscalar(t_glist *x, int natoms, t_atom *vec,
    int *p_nextmsg, int selectit)
{
    int message, nline;
    t_template *template;
    t_symbol *templatesym;
    t_scalar *sc;
    int nextmsg = *p_nextmsg;
    int wasvis = glist_isvisible(x);

    if (nextmsg >= natoms || vec[nextmsg].a_type != A_SYMBOL)
    {
        if (nextmsg < natoms)
            post("stopping early: type %d", vec[nextmsg].a_type);
        *p_nextmsg = natoms;
        return (0);
    }
    templatesym = canvas_makebindsym(vec[nextmsg].a_w.w_symbol);
    *p_nextmsg = nextmsg + 1;

    if (!(template = template_findbyname(templatesym)))
    {
        pd_error(0, "canvas_read: %s: no such template", templatesym->s_name);
        *p_nextmsg = natoms;
        return (0);
    }
    sc = scalar_new(x, templatesym);
    if (!sc)
    {
        pd_error(0, "couldn't create scalar \"%s\"", templatesym->s_name);
        *p_nextmsg = natoms;
        return (0);
    }
    if (wasvis)
    {
            /* temporarily lie about vis flag while this is built */
        glist_getcanvas(x)->gl_mapped = 0;
    }
    glist_add(x, &sc->sc_gobj);

    nline = canvas_scanbinbuf(natoms, vec, &message, p_nextmsg);
    glist_readatoms(x, natoms, vec, p_nextmsg, templatesym, sc->sc_vec,
        nline, vec + message);
    if (wasvis)
    {
            /* reset vis flag as before */
        glist_getcanvas(x)->gl_mapped = 1;
        gobj_vis(&sc->sc_gobj, x, 1);
    }
    if (selectit)
    {
        glist_select(x, &sc->sc_gobj);
    }
    return (1);
}